

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O1

int CVodeGetQuadSensNumErrTestFails(void *cvode_mem,long *nQSetfails)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x7ec;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x108) != 0) {
      *nQSetfails = *(long *)((long)cvode_mem + 0x6c0);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis for quadrature variables not activated.";
    iVar1 = -0x32;
    error_code = -0x32;
    line = 0x7f4;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetQuadSensNumErrTestFails",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeGetQuadSensNumErrTestFails(void* cvode_mem, long int* nQSetfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_quadr_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_QUADSENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_QUADSENSI);
    return (CV_NO_QUADSENS);
  }

  *nQSetfails = cv_mem->cv_netfQS;

  return (CV_SUCCESS);
}